

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void SpecialFreeUnit(CPpmd8 *p,void *ptr)

{
  void *ptr_local;
  CPpmd8 *p_local;
  
  if ((Byte *)ptr == p->UnitsStart) {
    p->UnitsStart = p->UnitsStart + 0xc;
  }
  else {
    InsertNode(p,ptr,0);
  }
  return;
}

Assistant:

static void SpecialFreeUnit(CPpmd8 *p, void *ptr)
{
  if ((Byte *)ptr != p->UnitsStart)
    InsertNode(p, ptr, 0);
  else
  {
    #ifdef PPMD8_FREEZE_SUPPORT
    *(UInt32 *)ptr = EMPTY_NODE; /* it's used for (Flags == 0xFF) check in RemoveBinContexts */
    #endif
    p->UnitsStart += UNIT_SIZE;
  }
}